

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DValidCallsTest::iterate
          (MultisampleTextureTexStorage2DValidCallsTest *this)

{
  GLuint *pGVar1;
  undefined1 uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  GLint *pGVar6;
  int n_samples;
  GLint GVar7;
  GLint gl_max_depth_texture_samples_value;
  undefined4 *local_70;
  long local_68;
  GLint GStack_5c;
  undefined4 uStack_58;
  GLint gl_max_color_texture_samples_value;
  MultisampleTextureTexStorage2DValidCallsTest *local_50;
  long lStack_48;
  long lStack_40;
  GLint internalformat_max_samples;
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  initInternals(this);
  pGVar6 = &gl_max_color_texture_samples_value;
  gl_max_color_texture_samples_value = 0;
  (**(code **)(lVar5 + 0x868))(0x910e,pGVar6);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x4b1);
  gl_max_depth_texture_samples_value = 0;
  (**(code **)(lVar5 + 0x868))(0x910f);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Could not retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x4b7);
  local_50 = this;
  pGVar1 = &this->to_id;
  local_68 = 5;
  local_70 = &DAT_01744ed0;
  do {
    GStack_5c = *pGVar6;
    for (lStack_48 = 0; lStack_48 != 2; lStack_48 = lStack_48 + 1) {
      uVar2 = (&DAT_01744ef0)[lStack_48];
      for (lStack_40 = 0; lStack_40 != local_68; lStack_40 = lStack_40 + 1) {
        uStack_58 = local_70[lStack_40];
        internalformat_max_samples = 0;
        iVar3 = 1;
        (**(code **)(lVar5 + 0x880))(0x9100,uStack_58,0x80a9,1,&internalformat_max_samples);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glGetInternalformativ() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                        ,0x4ff);
        GVar7 = internalformat_max_samples;
        if (GStack_5c <= internalformat_max_samples) {
          GVar7 = GStack_5c;
        }
        if (GVar7 < 2) {
          GVar7 = 1;
        }
        for (; iVar3 <= GVar7; iVar3 = iVar3 + 1) {
          (**(code **)(lVar5 + 0x1390))(0x9100,iVar3,uStack_58,1,1,uVar2);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"A valid glTexStorage2DMultisample() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                          ,0x50c);
          (**(code **)(lVar5 + 0x480))(1,pGVar1);
          (**(code **)(lVar5 + 0x6f8))(1,pGVar1);
          (**(code **)(lVar5 + 0xb8))(0x9100,*pGVar1);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"Failed to re-create a texture object",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                          ,0x514);
        }
      }
    }
    local_70 = &DAT_01744ee4;
    local_68 = 3;
    pGVar6 = &gl_max_depth_texture_samples_value;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DValidCallsTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value */
	glw::GLint gl_max_color_texture_samples_value = 0;

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &gl_max_color_texture_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value");

	/* Retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value */
	glw::GLint gl_max_depth_texture_samples_value = 0;

	gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &gl_max_depth_texture_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value");

	/* Iterate through color-, depth- and stencil-renderable internalformats */
	const glw::GLenum  color_internalformats[]   = { GL_R8, GL_RGB565, GL_RGB10_A2UI, GL_SRGB8_ALPHA8, GL_R8I };
	const glw::GLenum  depth_internalformats[]   = { GL_DEPTH_COMPONENT16, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8 };
	const glw::GLenum  stencil_internalformats[] = { GL_DEPTH24_STENCIL8, GL_DEPTH32F_STENCIL8 };
	const unsigned int n_color_internalformats   = sizeof(color_internalformats) / sizeof(color_internalformats[0]);
	const unsigned int n_depth_internalformats   = sizeof(depth_internalformats) / sizeof(depth_internalformats[0]);
	const unsigned int n_stencil_internalformats = sizeof(stencil_internalformats) / sizeof(stencil_internalformats[0]);

	for (unsigned int n_iteration = 0; n_iteration < 3 /* color/depth/stencil */; ++n_iteration)
	{
		const glw::GLenum* internalformats						   = NULL;
		glw::GLint		   max_iteration_specific_gl_samples_value = 0;
		unsigned int	   n_internalformats					   = 0;

		switch (n_iteration)
		{
		case 0:
		{
			internalformats							= color_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_color_texture_samples_value;
			n_internalformats						= n_color_internalformats;

			break;
		}

		case 1:
		{
			internalformats							= depth_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_depth_texture_samples_value;
			n_internalformats						= n_depth_internalformats;

			break;
		}

		case 2:
		{
			internalformats							= stencil_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_depth_texture_samples_value;
			n_internalformats						= n_stencil_internalformats;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized iteration index");
		}
		} /* switch (n_iteration) */

		/* Iterate through valid fixedsamplelocations argument values */
		const glw::GLboolean fixedsamplelocations_values[] = { GL_FALSE, GL_TRUE };
		const unsigned int   n_fixedsamplelocations_values =
			sizeof(fixedsamplelocations_values) / sizeof(fixedsamplelocations_values[0]);

		for (unsigned int n_fixedsamplelocations_value = 0;
			 n_fixedsamplelocations_value < n_fixedsamplelocations_values; ++n_fixedsamplelocations_value)
		{
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_values[n_fixedsamplelocations_value];

			/* Iterate through internalformats */
			for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
			{
				glw::GLenum internalformat			   = internalformats[n_internalformat];
				glw::GLint  internalformat_max_samples = 0;

				/* Retrieve internalformat-specific GL_MAX_SAMPLES value */
				gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE,	 /* target */
									   internalformat, GL_SAMPLES, 1, /* bufSize */
									   &internalformat_max_samples);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed");

				/* Determine maximum amount of samples we can use for the test*/
				glw::GLint max_samples =
					de::max(1, de::min(internalformat_max_samples, max_iteration_specific_gl_samples_value));

				/* Iterate through all valid samples argument values */
				for (int n_samples = 1; n_samples <= max_samples; ++n_samples)
				{
					gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, n_samples, internalformat, 1, /* width */
											   1,														/* height */
											   fixedsamplelocations); /* fixedsamplelocations */

					GLU_EXPECT_NO_ERROR(gl.getError(), "A valid glTexStorage2DMultisample() call failed");

					/* Re-create the texture object before we continue */
					gl.deleteTextures(1, &to_id);
					gl.genTextures(1, &to_id);

					gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to re-create a texture object");
				} /* for (all samples argument values) */
			}	 /* for (all color-renderable internalformats) */
		}		  /* for (all fixedsamplelocations argument values) */
	}			  /* for (all iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}